

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImRect *r;
  ImDrawList *this;
  float *pfVar1;
  bool *pbVar2;
  int *piVar3;
  ImVec2 *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar67;
  undefined8 uVar68;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImFontAtlas *pIVar9;
  value_type pIVar10;
  bool bVar11;
  undefined1 auVar12 [12];
  ulong uVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiID IVar17;
  bool bVar18;
  bool bVar19;
  int n;
  ImGuiInputSource IVar20;
  value_type *ppIVar21;
  long lVar22;
  char *pcVar23;
  char *__s;
  size_t sVar24;
  char *pcVar25;
  char *pcVar26;
  ImGuiSettingsHandler *pIVar27;
  void *pvVar28;
  ImFont *font;
  ImGuiNavMoveResult *pIVar29;
  value_type *pvVar30;
  ImGuiWindow *pIVar31;
  value_type *ppIVar32;
  int i_1;
  ImGuiWindow *pIVar33;
  ImGuiInputReadMode extraout_EDX;
  ImGuiInputReadMode extraout_EDX_00;
  ImGuiInputReadMode extraout_EDX_01;
  ImGuiInputReadMode mode;
  ImGuiWindow *parent_window;
  ImGuiWindow *new_nav_window;
  int i_2;
  int iVar34;
  ImGuiNavMoveResult *pIVar35;
  float *pfVar36;
  ImGuiWindow *pIVar37;
  ImGuiNavDirSourceFlags dir_sources;
  float *pfVar38;
  ImGuiID IVar39;
  ImGuiWindow *old_nav_window;
  char *pcVar40;
  ImGuiID IVar41;
  ImGuiID IVar42;
  char *pcVar43;
  byte bVar44;
  uint uVar45;
  uint uVar46;
  float fVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  undefined1 auVar51 [16];
  float fVar52;
  ImVec2 IVar54;
  float fVar53;
  ImVec2 IVar55;
  ImVec2 IVar56;
  undefined1 auVar57 [16];
  float fVar58;
  ImVec2 IVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ImRect IVar66;
  ImRect window_rect_rel;
  ImVec2 local_38;
  
  pIVar14 = GImGui;
  bVar44 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd63,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd68,"void ImGui::NewFrame()");
  }
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd69,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6b,"void ImGui::NewFrame()");
  }
  ppIVar21 = ImVector<ImFont_*>::operator[](&pIVar9->Fonts,0);
  if ((*ppIVar21)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if ((pIVar14->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  fVar58 = (pIVar14->Style).Alpha;
  if ((fVar58 < 0.0) || (1.0 < fVar58)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  if ((pIVar14->FrameCount != 0) && (pIVar14->FrameCountEnded != pIVar14->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  lVar22 = 0;
  while (lVar22 != 0x15) {
    piVar3 = (pIVar14->IO).KeyMap + lVar22;
    lVar22 = lVar22 + 1;
    if (0x200 < *piVar3 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd71,"void ImGui::NewFrame()");
    }
  }
  if ((((pIVar14->IO).ConfigFlags & 1) != 0) && ((pIVar14->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd75,"void ImGui::NewFrame()");
  }
  if (pIVar14->SettingsLoaded == false) {
    if ((pIVar14->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xd7a,"void ImGui::NewFrame()");
    }
    pcVar23 = (pIVar14->IO).IniFilename;
    if ((pcVar23 != (char *)0x0) &&
       (pcVar23 = (char *)ImFileLoadToMemory(pcVar23,"rb",(int *)0x0,1), pcVar23 != (char *)0x0)) {
      __s = ImStrdup(pcVar23);
      sVar24 = strlen(__s);
      pIVar15 = GImGui;
      pIVar27 = (ImGuiSettingsHandler *)0x0;
      pvVar28 = (void *)0x0;
      pcVar40 = __s;
      while (pcVar40 < __s + sVar24) {
        for (; (*pcVar40 == '\n' || (pcVar43 = pcVar40, *pcVar40 == '\r')); pcVar40 = pcVar40 + 1) {
        }
        for (; ((pcVar43 < __s + sVar24 && (*pcVar43 != '\n')) && (*pcVar43 != '\r'));
            pcVar43 = pcVar43 + 1) {
        }
        *pcVar43 = '\0';
        if (((pcVar40 < pcVar43) && (*pcVar40 == '[')) && (pcVar43[-1] == ']')) {
          pcVar26 = pcVar43 + -1;
          *pcVar26 = '\0';
          pcVar40 = pcVar40 + 1;
          pcVar25 = ImStrchrRange(pcVar40,pcVar26,']');
          if ((pcVar25 == (char *)0x0) ||
             (pcVar26 = ImStrchrRange(pcVar25 + 1,pcVar26,'['), pcVar26 == (char *)0x0)) {
            pcVar25 = "Window";
          }
          else {
            *pcVar25 = '\0';
            pcVar25 = pcVar40;
            pcVar40 = pcVar26 + 1;
          }
          pIVar27 = FindSettingsHandler(pcVar25);
          if (pIVar27 == (ImGuiSettingsHandler *)0x0) {
            pIVar27 = (ImGuiSettingsHandler *)0x0;
            pvVar28 = (void *)0x0;
          }
          else {
            pvVar28 = (*pIVar27->ReadOpenFn)(pIVar15,pIVar27,pcVar40);
          }
        }
        else if ((pIVar27 != (ImGuiSettingsHandler *)0x0) && (pvVar28 != (void *)0x0)) {
          (*pIVar27->ReadLineFn)(pIVar15,pIVar27,pvVar28,pcVar40);
        }
        pcVar40 = pcVar43 + 1;
      }
      MemFree(__s);
      pIVar15->SettingsLoaded = true;
      MemFree(pcVar23);
    }
    pIVar14->SettingsLoaded = true;
  }
  fVar58 = (pIVar14->IO).DeltaTime;
  if ((0.0 < pIVar14->SettingsDirtyTimer) &&
     (fVar52 = pIVar14->SettingsDirtyTimer - fVar58, pIVar14->SettingsDirtyTimer = fVar52,
     fVar52 <= 0.0)) {
    SaveIniSettingsToDisk((pIVar14->IO).IniFilename);
    fVar58 = (pIVar14->IO).DeltaTime;
  }
  pIVar14->Time = fVar58 + pIVar14->Time;
  pIVar14->FrameCount = pIVar14->FrameCount + 1;
  pIVar14->TooltipOverrideCount = 0;
  pIVar14->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar14->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xd8d,"void ImGui::NewFrame()");
  }
  fVar58 = (pIVar14->IO).DisplaySize.x;
  fVar52 = (pIVar14->IO).DisplaySize.y;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.z = fVar58;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.w = fVar52;
  (pIVar14->DrawListSharedData).CurveTessellationTol = (pIVar14->Style).CurveTessellationTol;
  this = &pIVar14->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar14->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar14->OverlayDrawList).Flags =
       (uint)(pIVar14->Style).AntiAliasedLines + (uint)(pIVar14->Style).AntiAliasedFill * 2;
  (pIVar14->DrawData).Valid = false;
  (pIVar14->DrawData).TotalVtxCount = 0;
  (pIVar14->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar14->DrawData).CmdListsCount = 0;
  (pIVar14->DrawData).TotalIdxCount = 0;
  if (pIVar14->HoveredIdPreviousFrame == 0) {
    pIVar14->HoveredIdTimer = 0.0;
  }
  pIVar14->HoveredIdPreviousFrame = pIVar14->HoveredId;
  pIVar14->HoveredId = 0;
  pIVar14->HoveredIdAllowOverlap = false;
  if ((pIVar14->ActiveIdIsAlive == false) &&
     (pIVar14->ActiveId != 0 && pIVar14->ActiveIdPreviousFrame == pIVar14->ActiveId)) {
    ClearActiveID();
  }
  IVar7 = pIVar14->ActiveId;
  if (IVar7 != 0) {
    pIVar14->ActiveIdTimer = (pIVar14->IO).DeltaTime + pIVar14->ActiveIdTimer;
  }
  pIVar14->ActiveIdPreviousFrame = IVar7;
  pIVar14->ActiveIdIsAlive = false;
  pIVar14->ActiveIdIsJustActivated = false;
  if (IVar7 != pIVar14->ScalarAsInputTextId && pIVar14->ScalarAsInputTextId != 0) {
    pIVar14->ScalarAsInputTextId = 0;
  }
  if ((pIVar14->DragDropActive == true) &&
     ((pIVar14->DragDropPayload).DataFrameCount + 1 < pIVar14->FrameCount)) {
    ClearDragDrop();
    ImVector<unsigned_char>::clear(&pIVar14->DragDropPayloadBufHeap);
    pIVar14->DragDropPayloadBufLocal[0] = '\0';
    pIVar14->DragDropPayloadBufLocal[1] = '\0';
    pIVar14->DragDropPayloadBufLocal[2] = '\0';
    pIVar14->DragDropPayloadBufLocal[3] = '\0';
    pIVar14->DragDropPayloadBufLocal[4] = '\0';
    pIVar14->DragDropPayloadBufLocal[5] = '\0';
    pIVar14->DragDropPayloadBufLocal[6] = '\0';
    pIVar14->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar14->DragDropAcceptIdPrev = pIVar14->DragDropAcceptIdCurr;
  pIVar14->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar14->DragDropAcceptIdCurr = 0;
  pfVar1 = (pIVar14->IO).KeysDownDuration;
  memcpy((pIVar14->IO).KeysDownDurationPrev,pfVar1,0x800);
  for (lVar22 = 0; pIVar15 = GImGui, lVar22 != 0x200; lVar22 = lVar22 + 1) {
    fVar58 = -1.0;
    if ((pIVar14->IO).KeysDown[lVar22] == true) {
      fVar58 = 0.0;
      if (0.0 <= pfVar1[lVar22]) {
        fVar58 = pfVar1[lVar22] + (pIVar14->IO).DeltaTime;
      }
    }
    pfVar1[lVar22] = fVar58;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar45 = (pIVar15->IO).ConfigFlags;
  if ((((uVar45 & 2) != 0) && (((pIVar15->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar15->IO).NavInputs[0] ||
      (((0.0 < (pIVar15->IO).NavInputs[2] || (0.0 < (pIVar15->IO).NavInputs[1])) ||
       (0.0 < (pIVar15->IO).NavInputs[3])))))) {
    pIVar15->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar45 & 1) != 0) {
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[0xc]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[0] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[0xd]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[2] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[0xe]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[1] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[1]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[0x11] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[2]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[0x12] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[3]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[0x13] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar18 = IsKeyDown((pIVar15->IO).KeyMap[4]);
    if (bVar18) {
      (pIVar15->IO).NavInputs[0x14] = 1.0;
      pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    if ((pIVar15->IO).KeyCtrl == true) {
      (pIVar15->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar15->IO).KeyShift == true) {
      (pIVar15->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar15->IO).KeyAlt == true) {
      (pIVar15->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar1 = (pIVar15->IO).NavInputsDownDuration;
  pfVar36 = pfVar1;
  pfVar38 = (pIVar15->IO).NavInputsDownDurationPrev;
  for (lVar22 = 0x15; lVar22 != 0; lVar22 = lVar22 + -1) {
    *pfVar38 = *pfVar36;
    pfVar36 = pfVar36 + (ulong)bVar44 * -2 + 1;
    pfVar38 = pfVar38 + (ulong)bVar44 * -2 + 1;
  }
  for (lVar22 = 0; lVar22 != 0x15; lVar22 = lVar22 + 1) {
    fVar58 = -1.0;
    if (0.0 < (pIVar15->IO).NavInputs[lVar22]) {
      fVar58 = 0.0;
      if (0.0 <= pfVar1[lVar22]) {
        fVar58 = pfVar1[lVar22] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar1[lVar22] = fVar58;
  }
  IVar7 = pIVar15->NavInitResultId;
  if ((IVar7 != 0) &&
     ((pIVar15->NavDisableHighlight != true || (pIVar15->NavInitRequestFromMove == true)))) {
    if (pIVar15->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xbe1,"void ImGui::NavUpdate()");
    }
    if (pIVar15->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar7,pIVar15->NavLayer,&pIVar15->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar7,pIVar15->NavLayer);
    }
    IVar48 = (pIVar15->NavInitResultRectRel).Max;
    pIVar4 = &pIVar15->NavWindow->NavRectRel[pIVar15->NavLayer].Min;
    *pIVar4 = (pIVar15->NavInitResultRectRel).Min;
    pIVar4[1] = IVar48;
  }
  pIVar15->NavInitRequest = false;
  pIVar15->NavInitRequestFromMove = false;
  pIVar15->NavInitResultId = 0;
  pIVar15->NavJustMovedToId = 0;
  if (pIVar15->NavMoveRequest == true) {
    pIVar35 = &pIVar15->NavMoveResultOther;
    IVar7 = (pIVar15->NavMoveResultOther).ID;
    if ((pIVar15->NavMoveResultLocal).ID == 0) {
      pIVar29 = pIVar35;
      if (IVar7 != 0) goto LAB_001569c3;
    }
    else {
      pIVar29 = &pIVar15->NavMoveResultLocal;
      if (IVar7 == 0) {
        pIVar31 = pIVar15->NavWindow;
LAB_001569e6:
        pIVar33 = pIVar31;
        pIVar35 = pIVar29;
      }
      else {
LAB_001569c3:
        pIVar31 = pIVar15->NavWindow;
        pIVar33 = ((pIVar15->NavMoveResultOther).Window)->ParentWindow;
        if (pIVar33 != pIVar31) goto LAB_001569e6;
        fVar58 = (pIVar15->NavMoveResultLocal).DistBox;
        fVar52 = (pIVar15->NavMoveResultOther).DistBox;
        if ((fVar58 <= fVar52) &&
           (((pIVar31 = pIVar33, fVar52 != fVar58 || (NAN(fVar52) || NAN(fVar58))) ||
            (fVar58 = (pIVar15->NavMoveResultLocal).DistCenter,
            pfVar1 = &(pIVar15->NavMoveResultOther).DistCenter,
            fVar58 < *pfVar1 || fVar58 == *pfVar1)))) goto LAB_001569e6;
      }
      if ((pIVar33 == (ImGuiWindow *)0x0) ||
         (pIVar31 = pIVar35->Window, pIVar31 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0xbf6,"void ImGui::NavUpdate()");
      }
      if (pIVar15->NavLayer == 0) {
        r = &pIVar35->RectRel;
        IVar48 = (pIVar31->InnerRect).Min;
        fVar58 = (pIVar31->Pos).x;
        fVar52 = (pIVar31->Pos).y;
        IVar54 = (pIVar31->InnerRect).Max;
        window_rect_rel.Min.x = (IVar48.x - fVar58) + -1.0;
        window_rect_rel.Min.y = (IVar48.y - fVar52) + -1.0;
        window_rect_rel.Max.x = (IVar54.x - fVar58) + 1.0;
        window_rect_rel.Max.y = (IVar54.y - fVar52) + 1.0;
        bVar18 = ImRect::Contains(&window_rect_rel,r);
        pIVar16 = GImGui;
        if (!bVar18) {
          if (pIVar31->ScrollbarX == true) {
            fVar58 = (r->Min).x;
            if (window_rect_rel.Min.x <= fVar58) {
              fVar58 = (pIVar35->RectRel).Max.x;
              if (fVar58 < window_rect_rel.Max.x) goto LAB_00156aff;
              fVar58 = fVar58 + (pIVar31->Scroll).x + (GImGui->Style).ItemSpacing.x;
              fVar52 = 1.0;
            }
            else {
              fVar58 = (fVar58 + (pIVar31->Scroll).x) - (GImGui->Style).ItemSpacing.x;
              fVar52 = 0.0;
            }
            (pIVar31->ScrollTarget).x = fVar58;
            (pIVar31->ScrollTargetCenterRatio).x = fVar52;
          }
LAB_00156aff:
          fVar58 = (pIVar35->RectRel).Min.y;
          if (window_rect_rel.Min.y <= fVar58) {
            fVar58 = (pIVar35->RectRel).Max.y;
            if (window_rect_rel.Max.y <= fVar58) {
              fVar58 = fVar58 + (pIVar31->Scroll).y + (pIVar16->Style).ItemSpacing.y;
              fVar52 = 1.0;
              goto LAB_00156b44;
            }
          }
          else {
            fVar58 = (fVar58 + (pIVar31->Scroll).y) - (pIVar16->Style).ItemSpacing.y;
            fVar52 = 0.0;
LAB_00156b44:
            (pIVar31->ScrollTarget).y = fVar58;
            (pIVar31->ScrollTargetCenterRatio).y = fVar52;
          }
          IVar48 = CalcNextScrollFromScrollTargetAndClamp(pIVar31);
          local_38.x = (pIVar31->Scroll).x - IVar48.x;
          local_38.y = (pIVar31->Scroll).y - IVar48.y;
          ImRect::Translate(r,&local_38);
        }
      }
      ClearActiveID();
      pIVar15->NavWindow = pIVar35->Window;
      SetNavIDWithRectRel(pIVar35->ID,pIVar15->NavLayer,&pIVar35->RectRel);
      pIVar15->NavJustMovedToId = pIVar35->ID;
      pIVar15->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar15->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc07,"void ImGui::NavUpdate()");
    }
    if (((pIVar15->NavMoveResultLocal).ID == 0) && ((pIVar15->NavMoveResultOther).ID == 0)) {
      pIVar15->NavDisableHighlight = false;
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar15->NavMousePosDirty == true) && (pIVar15->NavIdIsAlive == true)) {
    if ((((pIVar15->IO).ConfigFlags & 4) != 0) && (((pIVar15->IO).BackendFlags & 4) != 0)) {
      if ((pIVar15->NavDisableHighlight != false) || (pIVar15->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0xc13,"void ImGui::NavUpdate()");
      }
      IVar48 = NavCalcPreferredRefPos();
      (pIVar15->IO).MousePosPrev = IVar48;
      (pIVar15->IO).MousePos = IVar48;
      (pIVar15->IO).WantSetMousePos = true;
    }
    pIVar15->NavMousePosDirty = false;
  }
  pIVar15->NavIdIsAlive = false;
  pIVar15->NavJustTabbedId = 0;
  uVar45 = pIVar15->NavLayer;
  if (1 < uVar45) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xc1b,"void ImGui::NavUpdate()");
  }
  pIVar31 = pIVar15->NavWindow;
  pIVar33 = pIVar31;
  if (pIVar31 != (ImGuiWindow *)0x0) {
    for (; pIVar33 != (ImGuiWindow *)0x0; pIVar33 = pIVar33->ParentWindow) {
      if ((pIVar33->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar33 != pIVar31) {
          pIVar33->NavLastChildNavWindow = pIVar31;
        }
        break;
      }
    }
    if ((uVar45 == 0) && (pIVar31->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar31->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    bVar18 = IsNavInputPressed(3,ImGuiInputReadMode_Pressed);
    if (((pIVar16->IO).KeyCtrl == true) && (bVar19 = IsKeyPressedMap(0,true), bVar19)) {
      bVar44 = (byte)(pIVar16->IO).ConfigFlags;
      uVar45 = (uint)bVar44;
      if (bVar18 || (bVar44 & 1) != 0) {
LAB_00156d22:
        pIVar31 = pIVar16->NavWindow;
        if ((pIVar31 != (ImGuiWindow *)0x0) ||
           (pIVar31 = FindWindowNavigable((pIVar16->Windows).Size + -1,-0x7fffffff,-1),
           pIVar31 != (ImGuiWindow *)0x0)) {
          pIVar16->NavWindowingTarget = pIVar31->RootWindowForTabbing;
          pIVar16->NavWindowingHighlightTimer = 0.0;
          pIVar16->NavWindowingHighlightAlpha = 0.0;
          pIVar16->NavWindowingToggleLayer = (bool)(~(byte)uVar45 & 1);
          pIVar16->NavInputSource = ImGuiInputSource_NavGamepad - (uVar45 & 1);
        }
      }
    }
    else if (bVar18) {
      uVar45 = 0;
      goto LAB_00156d22;
    }
    bVar18 = pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0;
  }
  else {
    bVar18 = false;
  }
  fVar58 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingHighlightTimer;
  pIVar16->NavWindowingHighlightTimer = fVar58;
  if (bVar18) {
LAB_00156f10:
    bVar18 = false;
    pIVar31 = (ImGuiWindow *)0x0;
  }
  else {
    IVar20 = pIVar16->NavInputSource;
    if (IVar20 != ImGuiInputSource_NavGamepad) {
LAB_00156e83:
      if (IVar20 == ImGuiInputSource_NavKeyboard) {
        fVar52 = (pIVar16->NavWindowingHighlightTimer + -0.15) / 0.04;
        fVar58 = 1.0;
        if (fVar52 <= 1.0) {
          fVar58 = fVar52;
        }
        fVar58 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar58);
        uVar45 = -(uint)(fVar58 <= pIVar16->NavWindowingHighlightAlpha);
        pIVar16->NavWindowingHighlightAlpha =
             (float)(uVar45 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar45 & (uint)fVar58);
        bVar18 = IsKeyPressedMap(0,true);
        if (bVar18) {
          NavUpdateWindowingHighlightWindow((pIVar16->IO).KeyShift - 1 | 1);
        }
        if ((pIVar16->IO).KeyCtrl == false) {
          pIVar31 = pIVar16->NavWindowingTarget;
          bVar18 = false;
          goto LAB_00156f14;
        }
      }
      goto LAB_00156f10;
    }
    fVar52 = (fVar58 + -0.2) / 0.05;
    fVar58 = 1.0;
    if (fVar52 <= 1.0) {
      fVar58 = fVar52;
    }
    fVar58 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar58);
    uVar45 = -(uint)(fVar58 <= pIVar16->NavWindowingHighlightAlpha);
    fVar58 = (float)(uVar45 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar45 & (uint)fVar58);
    pIVar16->NavWindowingHighlightAlpha = fVar58;
    bVar18 = IsNavInputPressed(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar19 = IsNavInputPressed(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar18 - (uint)bVar19 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar18 - (uint)bVar19);
      pIVar16->NavWindowingHighlightAlpha = 1.0;
      fVar58 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00156f10;
      IVar20 = pIVar16->NavInputSource;
      goto LAB_00156e83;
    }
    pbVar2 = &pIVar16->NavWindowingToggleLayer;
    *pbVar2 = (bool)(*pbVar2 & fVar58 < 1.0);
    if (*pbVar2 == false) {
      pIVar31 = pIVar16->NavWindowingTarget;
      bVar18 = false;
    }
    else {
      bVar18 = pIVar16->NavWindow != (ImGuiWindow *)0x0;
      pIVar31 = (ImGuiWindow *)0x0;
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00156f14:
  if (((pIVar16->ActiveId == 0) || (pIVar16->ActiveIdAllowOverlap == true)) &&
     (bVar19 = IsNavInputPressed(0x10,ImGuiInputReadMode_Released), bVar19)) {
    if (-256000.0 <= (pIVar16->IO).MousePos.x) {
      bVar19 = -256000.0 <= (pIVar16->IO).MousePos.y;
    }
    else {
      bVar19 = false;
    }
    if (-256000.0 <= (pIVar16->IO).MousePosPrev.x) {
      bVar11 = -256000.0 <= (pIVar16->IO).MousePosPrev.y;
    }
    else {
      bVar11 = false;
    }
    bVar18 = (bool)(bVar18 | bVar19 ^ bVar11 ^ 1U);
  }
  pIVar33 = pIVar16->NavWindowingTarget;
  if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 4) == 0)) {
    if (pIVar16->NavInputSource == ImGuiInputSource_NavGamepad) {
      dir_sources = 4;
LAB_00156ffc:
      IVar48 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar48.x = 0.0;
      IVar48.y = 0.0;
      if ((pIVar16->NavInputSource == ImGuiInputSource_NavKeyboard) &&
         (dir_sources = 1, (pIVar16->IO).KeyShift == false)) goto LAB_00156ffc;
    }
    fVar58 = IVar48.y;
    if (((IVar48.x != 0.0) || (fVar58 != 0.0)) || (NAN(fVar58))) {
      fVar52 = (pIVar16->IO).DisplayFramebufferScale.x;
      fVar47 = (pIVar16->IO).DisplayFramebufferScale.y;
      if (fVar47 <= fVar52) {
        fVar52 = fVar47;
      }
      fVar52 = (float)(int)(fVar52 * (pIVar16->IO).DeltaTime * 800.0);
      IVar54.x = (pIVar33->Pos).x + IVar48.x * fVar52;
      IVar54.y = (pIVar33->Pos).y + fVar58 * fVar52;
      pIVar33->Pos = IVar54;
      pIVar16->NavDisableMouseHover = true;
      ::MarkIniSettingsDirty(pIVar33);
    }
  }
  if (pIVar31 != (ImGuiWindow *)0x0) {
    if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar31 != pIVar16->NavWindow->RootWindowForTabbing)) {
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      pIVar33 = pIVar31->NavLastChildNavWindow;
      if (pIVar31->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar33 = pIVar31;
      }
      ClosePopupsOverWindow(pIVar33);
      FocusWindow(pIVar33);
      if (pIVar33->NavLastIds[0] == 0) {
        NavInitWindow(pIVar33,false);
      }
      if ((pIVar33->DC).NavLayerActiveMask == 2) {
        pIVar16->NavLayer = 1;
      }
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar18) && (pIVar31 = pIVar16->NavWindow, pIVar33 = pIVar31, pIVar31 != (ImGuiWindow *)0x0))
  {
    for (; (((pIVar33->DC).NavLayerActiveMask & 2) == 0 &&
           ((pIVar33->Flags & 0x15000000U) == 0x1000000)); pIVar33 = pIVar33->ParentWindow) {
    }
    if (pIVar33 != pIVar31) {
      FocusWindow(pIVar33);
      pIVar33->NavLastChildNavWindow = pIVar31;
      pIVar31 = pIVar16->NavWindow;
    }
    pIVar16->NavDisableHighlight = false;
    pIVar16->NavDisableMouseHover = true;
    uVar45 = 0;
    if (((pIVar31->DC).NavLayerActiveMask & 2) != 0) {
      uVar45 = pIVar16->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar45);
  }
  uVar45 = (pIVar15->IO).ConfigFlags;
  if ((uVar45 & 2) == 0) {
    bVar44 = 0;
  }
  else {
    bVar44 = (byte)(pIVar15->IO).BackendFlags & 1;
  }
  if ((((uVar45 & 1) == 0) && (bVar44 == 0)) || (pIVar15->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar15->IO).NavActive = false;
LAB_001571bc:
    bVar18 = true;
    if (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar18 = pIVar15->NavInitRequest;
    }
  }
  else {
    bVar18 = (pIVar15->NavWindow->Flags & 0x40000U) == 0;
    (pIVar15->IO).NavActive = bVar18;
    if (((!bVar18) || (pIVar15->NavId == 0)) ||
       (bVar18 = true, pIVar15->NavDisableHighlight != false)) goto LAB_001571bc;
  }
  (pIVar15->IO).NavVisible = bVar18;
  bVar18 = IsNavInputPressed(1,ImGuiInputReadMode_Pressed);
  if (bVar18) {
    if (pIVar15->ActiveId == 0) {
      pIVar31 = pIVar15->NavWindow;
      if (((pIVar31 == (ImGuiWindow *)0x0) || ((pIVar31->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar31->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar15->OpenPopupStack).Size < 1) {
          if (pIVar15->NavLayer == 0) {
            if ((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 0x5000000U) != 0x1000000)) {
              pIVar31->NavLastIds[0] = 0;
            }
            pIVar15->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else {
          pvVar30 = ImVector<ImGuiPopupRef>::back(&pIVar15->OpenPopupStack);
          if ((pvVar30->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar15->OpenPopupStack).Size + -1);
          }
        }
      }
      else {
        if (pIVar31->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0xc37,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar31->ParentWindow);
        SetNavID(pIVar31->ChildId,0);
        pIVar15->NavIdIsAlive = false;
        if (pIVar15->NavDisableMouseHover == true) {
          pIVar15->NavMousePosDirty = true;
        }
      }
    }
    else {
      ClearActiveID();
    }
  }
  pIVar15->NavActivateId = 0;
  pIVar15->NavActivateDownId = 0;
  pIVar15->NavActivatePressedId = 0;
  pIVar15->NavInputId = 0;
  IVar7 = pIVar15->NavId;
  IVar39 = 0;
  if ((IVar7 == 0) || (pIVar15->NavDisableHighlight != false)) {
    IVar41 = 0;
    IVar39 = 0;
LAB_0015723d:
    pIVar31 = pIVar15->NavWindow;
    bVar18 = pIVar31 == (ImGuiWindow *)0x0;
    if ((!bVar18) && ((pIVar31->Flags & 0x40000) != 0)) {
      pIVar15->NavDisableHighlight = true;
    }
    if (IVar39 != IVar41 && IVar41 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc64,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar41 = 0;
    if (pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0015723d;
    IVar39 = 0;
    if (pIVar15->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar15->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar18 = IsNavInputPressed(0,ImGuiInputReadMode_Pressed);
          IVar8 = pIVar15->ActiveId;
          IVar17 = IVar7;
          if (IVar8 == 0 && bVar18) {
            pIVar15->NavActivateId = IVar7;
            pIVar15->NavActivateDownId = IVar7;
            IVar42 = IVar7;
LAB_0015769a:
            pIVar15->NavActivatePressedId = IVar7;
          }
          else if (IVar8 == 0) {
            pIVar15->NavActivateDownId = IVar7;
            IVar42 = 0;
            if (bVar18) goto LAB_0015769a;
          }
          else {
            IVar39 = 0;
            IVar42 = 0;
            IVar41 = 0;
            if (IVar8 != IVar7) goto LAB_0015723d;
            pIVar15->NavActivateDownId = IVar7;
            if (bVar18 && IVar8 == IVar7) goto LAB_0015769a;
          }
LAB_001576a5:
          IVar41 = IVar42;
          IVar39 = IVar17;
          bVar18 = IsNavInputPressed(2,ImGuiInputReadMode_Pressed);
          if (bVar18) {
            pIVar15->NavInputId = IVar7;
          }
        }
        else {
          IVar39 = 0;
          IVar17 = 0;
          IVar42 = 0;
          if (pIVar15->ActiveId == IVar7 || pIVar15->ActiveId == 0) goto LAB_001576a5;
        }
      }
      goto LAB_0015723d;
    }
    bVar18 = true;
    pIVar31 = (ImGuiWindow *)0x0;
  }
  pIVar15->NavMoveRequest = false;
  IVar39 = pIVar15->NavNextActivateId;
  if (IVar39 != 0) {
    pIVar15->NavActivateId = IVar39;
    pIVar15->NavActivateDownId = IVar39;
    pIVar15->NavActivatePressedId = IVar39;
    pIVar15->NavInputId = IVar39;
  }
  pIVar15->NavNextActivateId = 0;
  if (pIVar15->ActiveId == 0) {
    uVar45 = 0xffffffff;
  }
  else {
    uVar45 = pIVar15->ActiveIdAllowNavDirFlags;
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar15->NavMoveDir = -1;
    if (((!bVar18) &&
        (bVar18 = pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0,
        mode = (ImGuiInputReadMode)(uVar45 != 0 && bVar18), uVar45 != 0 && bVar18)) &&
       ((pIVar31->Flags & 0x40000) == 0)) {
      iVar34 = -1;
      if (((uVar45 & 1) != 0) &&
         (bVar18 = IsNavInputPressedAnyOfTwo(4,0x11,mode), mode = extraout_EDX, bVar18)) {
        pIVar15->NavMoveDir = 0;
        iVar34 = 0;
      }
      if (((uVar45 & 2) != 0) &&
         (bVar18 = IsNavInputPressedAnyOfTwo(5,0x12,mode), mode = extraout_EDX_00, bVar18)) {
        pIVar15->NavMoveDir = 1;
        iVar34 = 1;
      }
      if (((uVar45 & 4) != 0) &&
         (bVar18 = IsNavInputPressedAnyOfTwo(6,0x13,mode), mode = extraout_EDX_01, bVar18)) {
        iVar34 = 2;
        pIVar15->NavMoveDir = 2;
      }
      if (((uVar45 & 8) == 0) || (bVar18 = IsNavInputPressedAnyOfTwo(7,0x14,mode), !bVar18)) {
        if (iVar34 == -1) goto LAB_00157557;
      }
      else {
        pIVar15->NavMoveDir = 3;
        iVar34 = 3;
      }
      goto LAB_001572f1;
    }
  }
  else {
    iVar34 = pIVar15->NavMoveDir;
    if (iVar34 == -1) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7c,"void ImGui::NavUpdate()");
    }
    if (pIVar15->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xc7d,"void ImGui::NavUpdate()");
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
LAB_001572f1:
    pIVar15->NavMoveRequest = true;
    pIVar15->NavMoveDirLast = iVar34;
    if (IVar7 == 0) {
      pIVar15->NavInitRequest = true;
      pIVar15->NavInitRequestFromMove = true;
      pIVar15->NavInitResultId = 0;
      pIVar15->NavDisableHighlight = false;
    }
  }
LAB_00157557:
  NavUpdateAnyRequestFlag();
  pIVar31 = pIVar15->NavWindow;
  if (((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 0x40000) == 0)) &&
     (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar58 = (float)(int)(GImGui->FontBaseSize * pIVar31->FontWindowScale * 100.0 *
                          (pIVar15->IO).DeltaTime + 0.5);
    if ((((pIVar31->DC).NavLayerActiveMask == 0) && ((pIVar31->DC).NavHasScroll == true)) &&
       (pIVar15->NavMoveRequest == true)) {
      uVar45 = pIVar15->NavMoveDir;
      if (uVar45 < 2) {
        fVar52 = (pIVar31->Scroll).x;
        fVar47 = (pIVar31->DC).CursorMaxPos.x;
        fVar53 = (float)(int)(*(float *)(&DAT_001a7cc8 + (ulong)(uVar45 == 0) * 4) * fVar58 + fVar52
                             );
        (pIVar31->Scroll).x = fVar53;
        (pIVar31->DC).CursorMaxPos.x = (fVar52 + fVar47) - fVar53;
      }
      else if ((uVar45 & 0xfffffffe) == 2) {
        fVar52 = (pIVar31->Scroll).y;
        fVar47 = (pIVar31->DC).CursorMaxPos.y;
        fVar53 = (float)(int)(*(float *)(&DAT_001a7cc8 + (ulong)(uVar45 == 2) * 4) * fVar58 + fVar52
                             );
        (pIVar31->Scroll).y = fVar53;
        (pIVar31->DC).CursorMaxPos.y = (fVar52 + fVar47) - fVar53;
      }
    }
    IVar48 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar52 = IVar48.x;
    fVar47 = IVar48.y;
    if (((fVar52 != 0.0) || (NAN(fVar52))) && (pIVar31->ScrollbarX == true)) {
      fVar53 = (pIVar31->Scroll).x;
      fVar62 = (float)(int)(fVar52 * fVar58 + fVar53);
      fVar52 = (pIVar31->DC).CursorMaxPos.x;
      (pIVar31->Scroll).x = fVar62;
      (pIVar31->DC).CursorMaxPos.x = (fVar53 + fVar52) - fVar62;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      fVar52 = (pIVar31->Scroll).y;
      fVar47 = (float)(int)(fVar47 * fVar58 + fVar52);
      fVar58 = (pIVar31->DC).CursorMaxPos.y;
      (pIVar31->Scroll).y = fVar47;
      (pIVar31->DC).CursorMaxPos.y = (fVar52 + fVar58) - fVar47;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar15->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar15->NavMoveResultOther);
  if (((pIVar15->NavMoveRequest == true) && (pIVar15->NavMoveFromClampedRefRect == true)) &&
     (pIVar15->NavLayer == 0)) {
    pIVar31 = pIVar15->NavWindow;
    IVar48 = (pIVar31->InnerRect).Min;
    fVar58 = (pIVar31->Pos).x;
    fVar52 = (pIVar31->Pos).y;
    IVar54 = (pIVar31->InnerRect).Max;
    window_rect_rel.Min.x = (IVar48.x - fVar58) + -1.0;
    window_rect_rel.Min.y = (IVar48.y - fVar52) + -1.0;
    window_rect_rel.Max.x = (IVar54.x - fVar58) + 1.0;
    window_rect_rel.Max.y = (IVar54.y - fVar52) + 1.0;
    bVar18 = ImRect::Contains(&window_rect_rel,pIVar31->NavRectRel);
    if (!bVar18) {
      auVar61._0_4_ = GImGui->FontBaseSize * pIVar31->FontWindowScale * 0.5;
      auVar60._0_4_ = window_rect_rel.Max.x - window_rect_rel.Min.x;
      auVar60._4_4_ = window_rect_rel.Max.y - window_rect_rel.Min.y;
      auVar60._8_4_ = window_rect_rel.Max.x - window_rect_rel.Max.x;
      auVar60._12_4_ = window_rect_rel.Max.y - window_rect_rel.Max.y;
      auVar61._4_4_ = auVar61._0_4_;
      auVar61._8_4_ = auVar61._0_4_;
      auVar61._12_4_ = auVar61._0_4_;
      auVar61 = minps(auVar60,auVar61);
      window_rect_rel.Min.x = auVar61._0_4_ + window_rect_rel.Min.x;
      window_rect_rel.Min.y = auVar61._4_4_ + window_rect_rel.Min.y;
      window_rect_rel.Max.x = window_rect_rel.Max.x - auVar61._0_4_;
      window_rect_rel.Max.y = window_rect_rel.Max.y - auVar61._4_4_;
      ImRect::ClipWith(pIVar31->NavRectRel + pIVar15->NavLayer,&window_rect_rel);
      pIVar15->NavId = 0;
    }
    pIVar15->NavMoveFromClampedRefRect = false;
  }
  pIVar31 = pIVar15->NavWindow;
  if (pIVar31 == (ImGuiWindow *)0x0) {
    IVar66 = GetViewportRect();
  }
  else {
    IVar48 = pIVar31->NavRectRel[pIVar15->NavLayer].Min;
    IVar54 = pIVar31->NavRectRel[pIVar15->NavLayer].Max;
    IVar55.x = 0.0;
    IVar55.y = 0.0;
    IVar49.x = 0.0;
    IVar49.y = 0.0;
    if (IVar48.y <= IVar54.y && IVar48.x <= IVar54.x) {
      IVar49 = IVar48;
      IVar55 = IVar54;
    }
    fVar58 = (pIVar31->Pos).x;
    fVar52 = (pIVar31->Pos).y;
    IVar66.Min.y = IVar49.y + fVar52;
    IVar66.Min.x = IVar49.x + fVar58;
    IVar66.Max.y = IVar55.y + fVar52;
    IVar66.Max.x = IVar55.x + fVar58;
  }
  pIVar15->NavScoringRectScreen = IVar66;
  fVar58 = IVar66.Min.x + 1.0;
  if (IVar66.Max.x <= fVar58) {
    fVar58 = IVar66.Max.x;
  }
  (pIVar15->NavScoringRectScreen).Min.x = fVar58;
  (pIVar15->NavScoringRectScreen).Max.x = fVar58;
  if (IVar66.Max.y < IVar66.Min.y) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xcc6,"void ImGui::NavUpdate()");
  }
  pIVar15->NavScoringCount = 0;
  pIVar15 = GImGui;
  fVar58 = (GImGui->IO).MousePos.x;
  if (((fVar58 < -256000.0) || (fVar52 = (GImGui->IO).MousePos.y, fVar52 < -256000.0)) ||
     ((fVar47 = (GImGui->IO).MousePosPrev.x, fVar47 < -256000.0 ||
      (fVar53 = (GImGui->IO).MousePosPrev.y, fVar53 < -256000.0)))) {
    (pIVar15->IO).MouseDelta.x = 0.0;
    (pIVar15->IO).MouseDelta.y = 0.0;
  }
  else {
    fVar58 = fVar58 - fVar47;
    fVar52 = fVar52 - fVar53;
    IVar59.y = fVar52;
    IVar59.x = fVar58;
    (GImGui->IO).MouseDelta = IVar59;
    if (((fVar58 != 0.0) || (fVar52 != 0.0)) || (NAN(fVar52))) {
      pIVar15->NavDisableMouseHover = false;
    }
  }
  IVar48 = (pIVar15->IO).MousePos;
  (pIVar15->IO).MousePosPrev = IVar48;
  for (lVar22 = 0x40a; lVar22 != 0x40f; lVar22 = lVar22 + 1) {
    if (*(char *)((long)pIVar15 + lVar22 + -0x2fa) == '\x01') {
      fVar58 = *(float *)((long)pIVar15 + lVar22 * 4 + -0xc14);
      *(bool *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x46) = fVar58 < 0.0;
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x3c) = 0;
      *(float *)((long)pIVar15 + lVar22 * 4 + -0xc00) = fVar58;
      if (0.0 <= fVar58) {
        *(float *)((long)pIVar15 + lVar22 * 4 + -0xc14) = fVar58 + (pIVar15->IO).DeltaTime;
        *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x41) = 0;
        uVar5 = *(undefined8 *)((long)pIVar15 + lVar22 * 8 + -0x1c8c);
        uVar6 = *(undefined8 *)((long)pIVar15 + lVar22 * 8 + -0x1c14);
        auVar65._0_4_ = IVar48.x - (float)uVar5;
        auVar65._4_4_ = IVar48.y - (float)((ulong)uVar5 >> 0x20);
        auVar65._8_8_ = 0;
        uVar13 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
        auVar64._0_8_ = uVar13 ^ 0x8000000080000000;
        auVar64._8_4_ = 0x80000000;
        auVar64._12_4_ = 0x80000000;
        auVar61 = maxps(auVar64,auVar65);
        fVar58 = (float)uVar6;
        fVar52 = (float)((ulong)uVar6 >> 0x20);
        uVar45 = -(uint)(auVar61._0_4_ <= fVar58);
        uVar46 = -(uint)(auVar61._4_4_ <= fVar52);
        *(ulong *)((long)pIVar15 + lVar22 * 8 + -0x1c14) =
             CONCAT44(~uVar46 & (uint)auVar61._4_4_,~uVar45 & (uint)auVar61._0_4_) |
             CONCAT44((uint)fVar52 & uVar46,(uint)fVar58 & uVar45);
        fVar58 = *(float *)((long)pIVar15 + lVar22 * 4 + -0xbc4);
        fVar52 = auVar65._0_4_ * auVar65._0_4_ + auVar65._4_4_ * auVar65._4_4_;
        uVar45 = -(uint)(fVar52 <= fVar58);
        *(uint *)((long)pIVar15 + lVar22 * 4 + -0xbc4) =
             uVar45 & (uint)fVar58 | ~uVar45 & (uint)fVar52;
      }
      else {
        *(undefined4 *)((long)pIVar15 + lVar22 * 4 + -0xc14) = 0;
        *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x41) = 0;
        fVar58 = pIVar15->Time;
        if ((fVar58 - *(float *)((long)pIVar15 + lVar22 * 4 + -0xc3c) <
             (pIVar15->IO).MouseDoubleClickTime) &&
           (fVar47 = IVar48.x - *(float *)((long)pIVar15 + lVar22 * 8 + -0x1c8c),
           fVar53 = IVar48.y - *(float *)((long)pIVar15 + lVar22 * 8 + -0x1c88),
           fVar52 = (pIVar15->IO).MouseDoubleClickMaxDist, fVar58 = -3.4028235e+38,
           fVar47 * fVar47 + fVar53 * fVar53 < fVar52 * fVar52)) {
          *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x41) = 1;
          fVar58 = -3.4028235e+38;
        }
        *(float *)((long)pIVar15 + lVar22 * 4 + -0xc3c) = fVar58;
        *(ImVec2 *)((long)pIVar15 + lVar22 * 8 + -0x1c8c) = IVar48;
        *(undefined8 *)((long)pIVar15 + lVar22 * 8 + -0x1c14) = 0;
        *(undefined4 *)((long)pIVar15 + lVar22 * 4 + -0xbc4) = 0;
        if ((*(byte *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x46) & 1) != 0) {
          pIVar15->NavDisableMouseHover = false;
        }
      }
    }
    else {
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x46) = 0;
      fVar58 = *(float *)((long)pIVar15 + lVar22 * 4 + -0xc14);
      *(bool *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x3c) = 0.0 <= fVar58;
      *(float *)((long)pIVar15 + lVar22 * 4 + -0xc00) = fVar58;
      *(undefined4 *)((long)pIVar15 + lVar22 * 4 + -0xc14) = 0xbf800000;
      *(undefined1 *)((long)(pIVar15->IO).KeyMap + lVar22 + -0x41) = 0;
    }
  }
  fVar58 = (pIVar14->IO).DeltaTime;
  iVar34 = pIVar14->FramerateSecPerFrameIdx;
  pIVar14->FramerateSecPerFrameAccum =
       (fVar58 - pIVar14->FramerateSecPerFrame[iVar34]) + pIVar14->FramerateSecPerFrameAccum;
  pIVar14->FramerateSecPerFrame[iVar34] = fVar58;
  pIVar14->FramerateSecPerFrameIdx = (iVar34 + 1) % 0x78;
  uVar45 = -(uint)(0.0 < pIVar14->FramerateSecPerFrameAccum);
  (pIVar14->IO).Framerate =
       (float)(~uVar45 & 0x7f7fffff |
              (uint)(1.0 / (pIVar14->FramerateSecPerFrameAccum / 120.0)) & uVar45);
  pIVar15 = GImGui;
  pIVar31 = GImGui->MovingWindow;
  if (pIVar31 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (GImGui->ActiveIdWindow->MoveId == GImGui->ActiveId)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar15->IO).MouseDown[0] == false)) {
      ClearActiveID();
    }
  }
  else {
    GImGui->ActiveIdIsAlive = true;
    pIVar33 = pIVar31->RootWindow;
    if (pIVar33 == (ImGuiWindow *)0x0) {
      __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0xcd7,"void ImGui::UpdateMovingWindow()");
    }
    if ((((pIVar15->IO).MouseDown[0] != true) ||
        (fVar58 = (pIVar15->IO).MousePos.x, fVar58 < -256000.0)) ||
       (fVar52 = (pIVar15->IO).MousePos.y, fVar52 < -256000.0)) {
      ClearActiveID();
      pIVar15->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      window_rect_rel.Min.x = fVar58 - (pIVar15->ActiveIdClickOffset).x;
      window_rect_rel.Min.y = fVar52 - (pIVar15->ActiveIdClickOffset).y;
      fVar58 = (pIVar33->Pos).x;
      if ((fVar58 != window_rect_rel.Min.x) || (NAN(fVar58) || NAN(window_rect_rel.Min.x))) {
LAB_00157d36:
        ::MarkIniSettingsDirty(pIVar33);
        ::SetWindowPos(pIVar33,&window_rect_rel.Min,1);
        pIVar31 = pIVar15->MovingWindow;
      }
      else {
        fVar58 = (pIVar33->Pos).y;
        if ((fVar58 != window_rect_rel.Min.y) || (NAN(fVar58) || NAN(window_rect_rel.Min.y)))
        goto LAB_00157d36;
      }
      FocusWindow(pIVar31);
    }
  }
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar31 = GetFrontMostPopupModal();
  if (pIVar31 == (ImGuiWindow *)0x0) {
    fVar58 = 0.0;
  }
  else {
    fVar58 = (pIVar14->IO).DeltaTime * 6.0 + pIVar14->ModalWindowDarkeningRatio;
    if (1.0 <= fVar58) {
      fVar58 = 1.0;
    }
  }
  pIVar14->ModalWindowDarkeningRatio = fVar58;
  pIVar14->MouseCursor = 0;
  pIVar14->WantTextInputNextFrame = -1;
  pIVar14->WantCaptureMouseNextFrame = -1;
  pIVar14->WantCaptureKeyboardNextFrame = -1;
  (pIVar14->PlatformImePos).x = 1.0;
  (pIVar14->PlatformImePos).y = 1.0;
  pIVar31 = pIVar14->HoveredWindow;
  if (((pIVar31 != (ImGuiWindow *)0x0) && (pIVar31->Collapsed == false)) &&
     ((fVar58 = (pIVar14->IO).MouseWheel, pIVar33 = pIVar31, fVar58 != 0.0 ||
      ((fVar52 = (pIVar14->IO).MouseWheelH, fVar52 != 0.0 || (NAN(fVar52))))))) {
    do {
      pIVar37 = pIVar33;
      uVar45 = pIVar37->Flags;
      if ((uVar45 & 0x1000218) != 0x1000010) break;
      pIVar33 = pIVar37->ParentWindow;
    } while (pIVar37->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      if ((pIVar14->IO).KeyCtrl == true) {
        if ((pIVar14->IO).FontAllowUserScaling == true) {
          fVar52 = fVar58 * 0.1 + pIVar31->FontWindowScale;
          fVar58 = 2.5;
          if (fVar52 <= 2.5) {
            fVar58 = fVar52;
          }
          fVar58 = (float)(-(uint)(fVar52 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar52 < 0.5) & (uint)fVar58);
          fVar47 = fVar58 / pIVar31->FontWindowScale;
          pIVar31->FontWindowScale = fVar58;
          fVar53 = 1.0 - fVar47;
          uVar67._0_4_ = (pIVar31->Pos).x;
          uVar67._4_4_ = (pIVar31->Pos).y;
          uVar68._0_4_ = (pIVar31->Size).x;
          uVar68._4_4_ = (pIVar31->Size).y;
          fVar58 = (float)((ulong)uVar67 >> 0x20);
          fVar52 = (float)((ulong)uVar68 >> 0x20);
          IVar48 = (pIVar14->IO).MousePos;
          auVar63._8_8_ = uVar68;
          auVar63._0_8_ = uVar68;
          auVar57._0_4_ =
               (IVar48.x - (float)(undefined4)uVar67) * fVar53 * (float)(undefined4)uVar68;
          auVar57._4_4_ = (IVar48.y - fVar58) * fVar53 * fVar52;
          auVar57._8_4_ = (0.0 - (float)(undefined4)uVar68) * fVar53 * (float)(undefined4)uVar68;
          auVar57._12_4_ = (0.0 - fVar52) * fVar53 * fVar52;
          auVar61 = divps(auVar57,auVar63);
          IVar56.x = auVar61._0_4_ + (float)(undefined4)uVar67;
          IVar56.y = auVar61._4_4_ + fVar58;
          auVar12._4_8_ = uVar68;
          auVar12._0_4_ = fVar58 * fVar47;
          auVar51._0_8_ = auVar12._0_8_ << 0x20;
          auVar51._8_4_ = (float)(undefined4)uVar68 * fVar47;
          auVar51._12_4_ = fVar52 * fVar47;
          pIVar31->Pos = IVar56;
          pIVar31->Size = auVar51._8_8_;
          IVar50.x = (pIVar31->SizeFull).x * fVar47;
          IVar50.y = (pIVar31->SizeFull).y * fVar47;
          pIVar31->SizeFull = IVar50;
        }
      }
      else {
        if ((uVar45 & 0x210) != 0) goto LAB_00157dd6;
        fVar47 = GImGui->FontBaseSize * pIVar37->FontWindowScale * 5.0;
        fVar52 = (pIVar37->WindowPadding).y;
        fVar52 = (fVar52 + fVar52 +
                 ((pIVar37->ContentsRegionRect).Max.y - (pIVar37->ContentsRegionRect).Min.y)) * 0.67
        ;
        if (fVar52 <= fVar47) {
          fVar47 = fVar52;
        }
        fVar52 = (pIVar37->Scroll).y;
        fVar53 = (pIVar37->DC).CursorMaxPos.y;
        fVar58 = fVar52 - fVar58 * (float)(int)fVar47;
        (pIVar37->Scroll).y = fVar58;
        (pIVar37->DC).CursorMaxPos.y = (fVar52 + fVar53) - fVar58;
      }
    }
    if ((uVar45 & 0x210) == 0) {
      fVar58 = (pIVar14->IO).MouseWheelH;
      if ((((fVar58 != 0.0) || (NAN(fVar58))) && ((pIVar14->IO).KeyCtrl == false)) &&
         ((pIVar31->Flags & 0x10) == 0)) {
        fVar52 = (pIVar31->Scroll).x;
        fVar47 = (pIVar31->DC).CursorMaxPos.x;
        fVar58 = fVar52 - fVar58 * GImGui->FontBaseSize * pIVar37->FontWindowScale;
        (pIVar31->Scroll).x = fVar58;
        (pIVar31->DC).CursorMaxPos.x = (fVar52 + fVar47) - fVar58;
      }
    }
  }
LAB_00157dd6:
  if ((((pIVar14->ActiveId == 0) && (pIVar31 = pIVar14->NavWindow, pIVar31 != (ImGuiWindow *)0x0))
      && ((pIVar31->Active == true &&
          (((pIVar31->Flags & 0x40000) == 0 && ((pIVar14->IO).KeyCtrl == false)))))) &&
     (bVar18 = IsKeyPressedMap(0,false), bVar18)) {
    if ((pIVar14->NavId == 0) || (pIVar14->NavIdTabCounter == 0x7fffffff)) {
      iVar34 = -(uint)(pIVar14->IO).KeyShift;
    }
    else {
      iVar34 = pIVar14->NavIdTabCounter + (-(uint)(pIVar14->IO).KeyShift | 1) + 1;
    }
    pIVar14->NavWindow->FocusIdxTabRequestNext = iVar34;
  }
  pIVar14->NavIdTabCounter = 0x7fffffff;
  for (iVar34 = 0; iVar34 != (pIVar14->Windows).Size; iVar34 = iVar34 + 1) {
    ppIVar32 = ImVector<ImGuiWindow_*>::operator[](&pIVar14->Windows,iVar34);
    pIVar10 = *ppIVar32;
    pIVar10->WasActive = pIVar10->Active;
    pIVar10->Active = false;
    pIVar10->WriteAccessed = false;
  }
  if ((pIVar14->NavWindow != (ImGuiWindow *)0x0) && (pIVar14->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar14->CurrentWindowStack,0);
  ImVector<ImGuiPopupRef>::resize(&pIVar14->CurrentPopupStack,0);
  ClosePopupsOverWindow(pIVar14->NavWindow);
  pIVar14 = GImGui;
  (pIVar14->NextWindowData).SizeVal.x = 400.0;
  (pIVar14->NextWindowData).SizeVal.y = 400.0;
  (pIVar14->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveIniSettingsToDisk(g.IO.IniFilename);
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();
    
    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}